

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolutionScaleCalculatorTests.cpp
# Opt level: O0

void __thiscall
ResolutionScaleCalculator_MaxDimensionEqualToWidthAndHeightReturnsWithAndHeihgt_Test::TestBody
          (ResolutionScaleCalculator_MaxDimensionEqualToWidthAndHeightReturnsWithAndHeihgt_Test
           *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_88;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  pair<int,_int> result;
  ResolutionScaleCalculator rsc;
  ResolutionScaleCalculator_MaxDimensionEqualToWidthAndHeightReturnsWithAndHeihgt_Test *this_local;
  
  unique0x100002bf = this;
  register0x00000000 =
       ResolutionScaleCalculator::ScaleToMaxDimension
                 ((ResolutionScaleCalculator *)((long)&result.first + 3),100,100,100);
  local_34 = 100;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"result.first","100",
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ResolutionScaleCalculatorTests.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_74 = 100;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_70,"result.second","100",(int *)&stack0xffffffffffffffe8,&local_74)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/tests/ResolutionScaleCalculatorTests.cpp"
                 ,0xb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  }
  return;
}

Assistant:

TEST(ResolutionScaleCalculator, MaxDimensionEqualToWidthAndHeightReturnsWithAndHeihgt)
{
    ResolutionScaleCalculator rsc;

    auto result = rsc.ScaleToMaxDimension(100, 100, 100);

    ASSERT_EQ(result.first, 100);
    ASSERT_EQ(result.second, 100);
}